

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

void Extra_ThreshSortByChowInverted(word *t,int nVars,int *pChow)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int t_1;
  int nWords;
  ulong uVar4;
  ulong uVar5;
  
  nWords = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  if (nVars < 2) {
    nVars = 1;
  }
  uVar5 = 0;
  bVar3 = false;
  do {
    while (bVar2 = bVar3, uVar4 = uVar5, nVars - 1 != uVar4) {
      iVar1 = pChow[uVar4];
      uVar5 = uVar4 + 1;
      bVar3 = bVar2;
      if (pChow[uVar4 + 1] < iVar1) {
        pChow[uVar4] = pChow[uVar4 + 1];
        pChow[uVar5] = iVar1;
        Abc_TtSwapAdjacent(t,nWords,(int)uVar4);
        bVar3 = true;
      }
    }
    uVar5 = 0;
    bVar3 = false;
  } while (bVar2);
  return;
}

Assistant:

void Extra_ThreshSortByChowInverted(word * t, int nVars, int * pChow) {
    int i, nWords = Abc_TtWordNum(nVars);
    //sort the variables by Chow in descending order
    while (1) {
        int fChange = 0;
        for (i = 0; i < nVars - 1; i++) {
            if (pChow[i] <= pChow[i + 1])
                continue;
            ABC_SWAP(int, pChow[i], pChow[i + 1]);
            Abc_TtSwapAdjacent(t, nWords, i);
            fChange = 1;
        }
        if (!fChange)
            return;
    }
}